

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,int>>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::pair<int,_int>_> *this,vector<double,_std::allocator<double>_> *data)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  bool result;
  pair<int,_int> tmp;
  pair<int,_int> *this_00;
  vector<double,_std::allocator<double>_> local_38;
  byte local_19;
  pair<int,_int> in_stack_ffffffffffffffe8;
  
  this_00 = (pair<int,_int> *)&stack0xffffffffffffffe8;
  std::pair<int,_int>::pair<int,_int,_true>(this_00);
  std::vector<double,_std::allocator<double>_>::vector
            (in_RSI,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe8);
  bVar1 = ParameterTraits<std::pair<int,int>>::convert<std::vector<double,std::allocator<double>>>
                    (&local_38,this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  local_19 = bVar1;
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::pair<int,_int>::operator=((pair<int,_int> *)(in_RDI + 0x2c),(type)&stack0xffffffffffffffe8)
    ;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }